

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

void __thiscall
glcts::ViewportArray::ViewportIndexSubroutine::prepareUniforms
          (ViewportIndexSubroutine *this,program *program,GLuint draw_call_index)

{
  int iVar1;
  GLint GVar2;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  GLchar *subroutine_name;
  GLuint index;
  undefined1 local_24 [4];
  
  iVar1 = (*((this->super_DrawTestBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  subroutine_name = "five";
  if (draw_call_index == 0) {
    subroutine_name = "four";
  }
  GVar2 = Utils::program::getSubroutineUniformLocation(program,"routine",0x8dd9);
  Utils::program::getSubroutineIndex(program,subroutine_name,0x8dd9);
  if (GVar2 == 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1668))(0x8dd9,1,local_24);
    err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(err,"UniformSubroutinesuiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xed5);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,
             "Something wrong, subroutine uniform location is not 0. Mistake in geometry shader?",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0xed1);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ViewportIndexSubroutine::prepareUniforms(Utils::program& program, GLuint draw_call_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const GLchar* subroutine_name = (0 == draw_call_index) ? "four" : "five";

	GLint  location = program.getSubroutineUniformLocation("routine", GL_GEOMETRY_SHADER);
	GLuint index	= program.getSubroutineIndex(subroutine_name, GL_GEOMETRY_SHADER);

	if (0 != location)
	{
		TCU_FAIL("Something wrong, subroutine uniform location is not 0. Mistake in geometry shader?");
	}

	gl.uniformSubroutinesuiv(GL_GEOMETRY_SHADER, 1, &index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");
}